

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<char,_false,_false>::push_back
          (FastVector<char,_false,_false> *this,char *valPtr,uint elem)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = this->count + elem;
  if (uVar4 < this->max) {
    for (uVar3 = 0; elem != uVar3; uVar3 = uVar3 + 1) {
      cVar1 = valPtr[uVar3];
      uVar4 = this->count;
      this->count = uVar4 + 1;
      this->data[uVar4] = cVar1;
    }
    return;
  }
  pcVar2 = this->data;
  grow_no_destroy(this,uVar4);
  for (uVar3 = 0; elem != uVar3; uVar3 = uVar3 + 1) {
    cVar1 = valPtr[uVar3];
    uVar4 = this->count;
    this->count = uVar4 + 1;
    this->data[uVar4] = cVar1;
  }
  if (pcVar2 != (char *)0x0) {
    (*(code *)NULLC::dealloc)(pcVar2);
    return;
  }
  return;
}

Assistant:

__forceinline void push_back(const T* valPtr, unsigned elem)
	{
		if(count + elem >= max)
		{
			grow_and_add(count + elem, valPtr, elem);
			return;
		}

		for(unsigned i = 0; i < elem; i++)
			data[count++] = valPtr[i];
	}